

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# purearrayfactory.cpp
# Opt level: O3

Array * __thiscall PureArrayFactory::getPureArray(PureArrayFactory *this,int v)

{
  Array *pAVar1;
  
  pAVar1 = (Array *)0x0;
  if ((-1 < v) && (v < this->_range)) {
    pAVar1 = this->_arrays[(uint)v];
    if (pAVar1 == (Array *)0x0) {
      pAVar1 = (Array *)operator_new(0x18);
      PureArray::PureArray((PureArray *)pAVar1,v,this->_width,this->_height);
      this->_arrays[(uint)v] = pAVar1;
      pAVar1 = this->_arrays[(uint)v];
    }
  }
  return pAVar1;
}

Assistant:

Array* PureArrayFactory::getPureArray(int v)
{
	if (v < 0 || v >= _range)
		return NULL;

	if (_arrays[v] == NULL) {
		_arrays[v] = new PureArray(v, _width, _height);
	}

	return _arrays[v];
}